

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateGetPrototype
          (ServiceGenerator *this,RequestOrResponse which,Printer *printer)

{
  long *plVar1;
  long lVar2;
  long alStack_310 [4];
  undefined1 auStack_2f0 [28];
  RequestOrResponse local_2d4;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0;
  undefined7 uStack_2bf;
  long lStack_2b8;
  undefined1 local_2b0 [32];
  string local_290;
  Printer *local_270;
  char *local_268;
  char *local_260;
  Sub local_258;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  auStack_2f0._16_8_ = 0x290510;
  local_2d4 = which;
  local_270 = printer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"which","");
  local_260 = "Response";
  if (which == kRequest) {
    local_260 = "Request";
  }
  auStack_2f0._16_8_ = 0x29053f;
  io::Printer::Sub::Sub<char_const*>(&local_258,&local_290,&local_260);
  local_2b0._0_8_ = local_2b0 + 0x10;
  auStack_2f0._16_8_ = 0x290568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"which_type","");
  local_268 = "output";
  if (local_2d4 == kRequest) {
    local_268 = "input";
  }
  auStack_2f0._16_8_ = 0x290594;
  io::Printer::Sub::Sub<char_const*>(&local_1a0,(string *)local_2b0,&local_268);
  auStack_2f0._16_8_ = 0x2905bd;
  local_2d0 = &local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"cases","");
  local_e8 = local_d8;
  if (local_2d0 == &local_2c0) {
    uStack_d0 = lStack_2b8;
  }
  else {
    local_e8 = local_2d0;
  }
  local_e0 = local_2c8;
  local_2c8 = 0;
  local_2c0 = 0;
  auStack_2f0._16_8_ = 0x290620;
  local_2d0 = &local_2c0;
  local_c8 = (undefined8 *)operator_new(0x20);
  *local_c8 = this;
  local_c8[1] = &local_2d4;
  local_c8[2] = &local_270;
  *(undefined1 *)(local_c8 + 3) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  auStack_2f0._16_8_ = 0x29069e;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x522f0c);
  local_38 = 0;
  auStack_2f0._16_8_ = 0x2906c6;
  io::Printer::Emit(printer,&local_258,3,0x1fa,
                    "\n        const $pb$::Message& $classname$::Get$which$Prototype(\n            const $pb$::MethodDescriptor* $nonnull$ method) const {\n          ABSL_DCHECK_EQ(method->service(), descriptor());\n          switch (method->index()) {\n            $cases$;\n\n            default:\n              ABSL_LOG(FATAL) << \"Bad method index; this should never happen.\";\n              return *$pb$::MessageFactory::generated_factory()->GetPrototype(\n                  method->$which_type$_type());\n          }\n        }\n      "
                   );
  lVar2 = 0x228;
  do {
    if (*(char *)((long)&local_260 + lVar2) == '\x01') {
      auStack_2f0._16_8_ = 0x2906ed;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_2b0 + lVar2 + 0x10));
    }
    if ((long *)(local_2b0 + lVar2 + -8) != *(long **)((long)&local_2c8 + lVar2)) {
      auStack_2f0._16_8_ = 0x290709;
      operator_delete(*(long **)((long)&local_2c8 + lVar2),*(long *)(local_2b0 + lVar2 + -8) + 1);
    }
    auStack_2f0._16_8_ = 0x29071c;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&local_2d0 + lVar2)]._M_data)
              ((anon_class_1_0_00000001 *)(auStack_2f0 + 0x1b),
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(auStack_2f0 + lVar2));
    plVar1 = (long *)((long)alStack_310 + lVar2 + 0x10);
    *(undefined1 *)((long)&local_2d0 + lVar2) = 0xff;
    if (plVar1 != *(long **)((long)alStack_310 + lVar2)) {
      auStack_2f0._16_8_ = 0x29073c;
      operator_delete(*(long **)((long)alStack_310 + lVar2),*plVar1 + 1);
    }
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != 0);
  if (local_2d0 != &local_2c0) {
    auStack_2f0._16_8_ = 0x29075c;
    operator_delete(local_2d0,CONCAT71(uStack_2bf,local_2c0) + 1);
  }
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    auStack_2f0._16_8_ = 0x290778;
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    auStack_2f0._16_8_ = 0x290794;
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateGetPrototype(RequestOrResponse which,
                                            io::Printer* printer) {
  printer->Emit(
      {
          {"which", which == kRequest ? "Request" : "Response"},
          {"which_type", which == kRequest ? "input" : "output"},
          {"cases",
           [&] {
             for (int i = 0; i < descriptor_->method_count(); ++i) {
               const MethodDescriptor* method = descriptor_->method(i);
               const Descriptor* type = which == kRequest
                                            ? method->input_type()
                                            : method->output_type();

               printer->Emit(
                   {
                       {"index", absl::StrCat(i)},
                       {"type", QualifiedClassName(type, *options_)},
                   },
                   R"cc(
                     case $index$:
                       return $type$::default_instance();
                   )cc");
             }
           }},
      },
      R"cc(
        const $pb$::Message& $classname$::Get$which$Prototype(
            const $pb$::MethodDescriptor* $nonnull$ method) const {
          ABSL_DCHECK_EQ(method->service(), descriptor());
          switch (method->index()) {
            $cases$;

            default:
              ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
              return *$pb$::MessageFactory::generated_factory()->GetPrototype(
                  method->$which_type$_type());
          }
        }
      )cc");
}